

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O0

PropertyT<unsigned_int> * __thiscall
OpenMesh::PropertyContainer::property<unsigned_int>
          (PropertyContainer *this,BasePropHandleT<unsigned_int> _h)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppBVar4;
  PropertyT<unsigned_int> *local_58;
  PropertyT<unsigned_int> *p;
  PropertyContainer *this_local;
  BasePropHandleT<unsigned_int> _h_local;
  
  this_local._4_4_ = _h.super_BaseHandle.idx_;
  iVar2 = BaseHandle::idx((BaseHandle *)((long)&this_local + 4));
  bVar1 = false;
  if (-1 < iVar2) {
    iVar2 = BaseHandle::idx((BaseHandle *)((long)&this_local + 4));
    sVar3 = std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::size
                      (&this->properties_);
    bVar1 = iVar2 < (int)sVar3;
  }
  if (!bVar1) {
    __assert_fail("_h.idx() >= 0 && _h.idx() < (int)properties_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Utils/PropertyContainer.hh"
                  ,0x91,
                  "PropertyT<T> &OpenMesh::PropertyContainer::property(BasePropHandleT<T>) [T = unsigned int]"
                 );
  }
  iVar2 = BaseHandle::idx((BaseHandle *)((long)&this_local + 4));
  ppBVar4 = std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::
            operator[](&this->properties_,(long)iVar2);
  if (*ppBVar4 == (value_type)0x0) {
    __assert_fail("properties_[_h.idx()] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Utils/PropertyContainer.hh"
                  ,0x92,
                  "PropertyT<T> &OpenMesh::PropertyContainer::property(BasePropHandleT<T>) [T = unsigned int]"
                 );
  }
  iVar2 = BaseHandle::idx((BaseHandle *)((long)&this_local + 4));
  ppBVar4 = std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::
            operator[](&this->properties_,(long)iVar2);
  if (*ppBVar4 == (value_type)0x0) {
    local_58 = (PropertyT<unsigned_int> *)0x0;
  }
  else {
    local_58 = (PropertyT<unsigned_int> *)
               __dynamic_cast(*ppBVar4,&BaseProperty::typeinfo,&PropertyT<unsigned_int>::typeinfo,0)
    ;
  }
  if (local_58 != (PropertyT<unsigned_int> *)0x0) {
    return local_58;
  }
  __assert_fail("p != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Utils/PropertyContainer.hh"
                ,0x97,
                "PropertyT<T> &OpenMesh::PropertyContainer::property(BasePropHandleT<T>) [T = unsigned int]"
               );
}

Assistant:

PropertyT<T>& property(BasePropHandleT<T> _h)
  {
    assert(_h.idx() >= 0 && _h.idx() < (int)properties_.size());
    assert(properties_[_h.idx()] != NULL);
#ifdef OM_FORCE_STATIC_CAST
    return *static_cast  <PropertyT<T>*> (properties_[_h.idx()]);
#else
    PropertyT<T>* p = dynamic_cast<PropertyT<T>*>(properties_[_h.idx()]);
    assert(p != NULL);
    return *p;
#endif
  }